

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::HasImportLibrary(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  cmValue l;
  bool bVar1;
  uint uVar2;
  TargetType TVar3;
  ManagedType MVar4;
  cmGlobalGenerator *pcVar5;
  byte local_f2;
  byte local_f1;
  string_view local_c0;
  cmValue local_b0;
  allocator<char> local_a1;
  string local_a0;
  cmValue local_80;
  cmValue varGenStubs;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue propGenStubs;
  bool generate_Stubs;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  propGenStubs.Value._7_1_ = 1;
  pcVar5 = GetGlobalGenerator(this);
  uVar2 = (*pcVar5->_vptr_cmGlobalGenerator[0x29])();
  if ((uVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS",&local_49);
    local_28 = GetProperty(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    bVar1 = cmValue::operator_cast_to_bool(&local_28);
    l.Value = local_28.Value;
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&varGenStubs,"YES");
      propGenStubs.Value._7_1_ = ::operator==(l,_varGenStubs);
    }
    else {
      this_00 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"CMAKE_XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS",&local_a1);
      local_80 = cmMakefile::GetDefinition(this_00,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
      bVar1 = cmValue::operator_cast_to_bool(&local_80);
      if (bVar1) {
        local_b0.Value = local_80.Value;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"YES");
        propGenStubs.Value._7_1_ = ::operator==(local_b0,local_c0);
      }
    }
  }
  bVar1 = IsDLLPlatform(this);
  if ((bVar1) &&
     ((TVar3 = GetType(this), TVar3 == SHARED_LIBRARY ||
      (bVar1 = IsExecutableWithExports(this), bVar1)))) {
    MVar4 = GetManagedType(this,config);
    local_f1 = 1;
    if (MVar4 != Managed) goto LAB_0074119f;
  }
  bVar1 = IsAIX(this);
  if (bVar1) {
    bVar1 = IsExecutableWithExports(this);
    local_f1 = 1;
    if (bVar1) goto LAB_0074119f;
  }
  bVar1 = cmMakefile::PlatformSupportsAppleTextStubs(this->Makefile);
  local_f2 = 0;
  if (bVar1) {
    bVar1 = IsSharedLibraryWithExports(this);
    local_f2 = 0;
    if (bVar1) {
      local_f2 = propGenStubs.Value._7_1_;
    }
  }
  local_f1 = local_f2;
LAB_0074119f:
  return (bool)(local_f1 & 1);
}

Assistant:

bool cmGeneratorTarget::HasImportLibrary(std::string const& config) const
{
  bool generate_Stubs = true;
  if (this->GetGlobalGenerator()->IsXcode()) {
    // take care of CMAKE_XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS variable
    // as well as XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS property
    if (cmValue propGenStubs =
          this->GetProperty("XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS")) {
      generate_Stubs = propGenStubs == "YES";
    } else if (cmValue varGenStubs = this->Makefile->GetDefinition(
                 "CMAKE_XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS")) {
      generate_Stubs = varGenStubs == "YES";
    }
  }

  return (this->IsDLLPlatform() &&
          (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
           this->IsExecutableWithExports()) &&
          // Assemblies which have only managed code do not have
          // import libraries.
          this->GetManagedType(config) != ManagedType::Managed) ||
    (this->IsAIX() && this->IsExecutableWithExports()) ||
    (this->Makefile->PlatformSupportsAppleTextStubs() &&
     this->IsSharedLibraryWithExports() && generate_Stubs);
}